

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ResumeThrow *curr,
          optional<wasm::HeapType> ct)

{
  Expression **ppEVar1;
  HeapTypeKind HVar2;
  Tag *pTVar3;
  size_t sVar4;
  Type *pTVar5;
  ulong uVar6;
  long lVar7;
  Signature SVar8;
  Iterator local_60;
  Type local_50;
  Type params;
  
  params.id = ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload;
  if (((undefined1  [16])
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    params.id = (uintptr_t)wasm::Type::getHeapType(&curr->cont->type);
  }
  HVar2 = HeapType::getKind((HeapType *)&params);
  if (HVar2 != Cont) {
    __assert_fail("ct->isContinuation()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x47c,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow(ResumeThrow *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  pTVar3 = Module::getTag(this->wasm,(Name)(curr->tag).super_IString.str);
  SVar8 = HeapType::getSignature(&pTVar3->type);
  local_50 = SVar8.params.id;
  sVar4 = wasm::Type::size(&local_50);
  if (sVar4 != (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements) {
    __assert_fail("params.size() == curr->operands.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x47e,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitResumeThrow(ResumeThrow *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  sVar4 = wasm::Type::size(&local_50);
  if (sVar4 != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar6) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      ppEVar1 = (curr->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      local_60.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           &local_50;
      local_60.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = uVar6;
      pTVar5 = wasm::Type::Iterator::operator*(&local_60);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)this,(Expression **)((long)ppEVar1 + lVar7),(Type)pTVar5->id
                );
      uVar6 = uVar6 + 1;
      sVar4 = wasm::Type::size(&local_50);
      lVar7 = lVar7 + 8;
    } while (uVar6 < sVar4);
  }
  if (((uint)(0x7c < params.id) * 4 + 3 & (uint)params.id) != 0) {
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->cont,(Type)(params.id | 2));
  return;
}

Assistant:

void visitResumeThrow(ResumeThrow* curr,
                        std::optional<HeapType> ct = std::nullopt) {
    if (!ct.has_value()) {
      ct = curr->cont->type.getHeapType();
    }
    assert(ct->isContinuation());
    auto params = wasm.getTag(curr->tag)->params();
    assert(params.size() == curr->operands.size());
    for (size_t i = 0; i < params.size(); ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->cont, Type(*ct, Nullable));
  }